

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O1

bool __thiscall MutableS2ShapeIndex::Iterator::Prev(Iterator *this)

{
  int iVar1;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar2;
  __pointer_type pSVar3;
  node_type *pnVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  pnVar4 = gtl::internal_btree::
           btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                       *)&this->index_->cell_map_);
  bVar6 = (this->iter_).node != pnVar4;
  bVar7 = (this->iter_).position != 0;
  if (bVar7 || bVar6) {
    gtl::internal_btree::
    btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
    ::decrement(&this->iter_);
    pbVar2 = (this->iter_).node;
    iVar1 = (this->iter_).position;
    if ((pbVar2 == (this->end_).node) && (iVar1 == (this->end_).position)) {
      (this->super_IteratorBase).id_.id_ = 0xffffffffffffffff;
      (this->super_IteratorBase).cell_._M_b._M_p = (__pointer_type)0x0;
    }
    else {
      if (((ulong)pbVar2 & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                      ,0x1e1,
                      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                     );
      }
      lVar5 = (long)iVar1 * 0x10;
      pSVar3 = *(__pointer_type *)&pbVar2[lVar5 + 0x18].field_0x0;
      (this->super_IteratorBase).id_.id_ = *(uint64 *)(pbVar2 + lVar5 + 0x10);
      (this->super_IteratorBase).cell_._M_b._M_p = pSVar3;
    }
  }
  return bVar7 || bVar6;
}

Assistant:

inline bool MutableS2ShapeIndex::Iterator::Prev() {
  if (iter_ == index_->cell_map_.begin()) return false;
  --iter_;
  Refresh();
  return true;
}